

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolarDecomposition.cpp
# Opt level: O2

uint __thiscall
btPolarDecomposition::decompose
          (btPolarDecomposition *this,btMatrix3x3 *a,btMatrix3x3 *u,btMatrix3x3 *h)

{
  btVector3 *pbVar1;
  btVector3 *pbVar2;
  undefined8 uVar3;
  uint uVar4;
  btScalar bVar5;
  btScalar bVar6;
  float local_f4;
  btMatrix3x3 *local_f0;
  btMatrix3x3 local_e8;
  undefined1 local_b8 [16];
  btMatrix3x3 local_a8;
  btMatrix3x3 local_78;
  btScalar local_48;
  
  uVar3 = *(undefined8 *)(a->m_el[0].m_floats + 2);
  *(undefined8 *)u->m_el[0].m_floats = *(undefined8 *)a->m_el[0].m_floats;
  *(undefined8 *)(u->m_el[0].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(a->m_el[1].m_floats + 2);
  *(undefined8 *)u->m_el[1].m_floats = *(undefined8 *)a->m_el[1].m_floats;
  *(undefined8 *)(u->m_el[1].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(a->m_el[2].m_floats + 2);
  *(undefined8 *)u->m_el[2].m_floats = *(undefined8 *)a->m_el[2].m_floats;
  *(undefined8 *)(u->m_el[2].m_floats + 2) = uVar3;
  local_f0 = a;
  btMatrix3x3::inverse(a);
  *(undefined8 *)h->m_el[0].m_floats = local_a8.m_el[0].m_floats._0_8_;
  *(ulong *)(h->m_el[0].m_floats + 2) =
       CONCAT44(local_a8.m_el[0].m_floats[3],local_a8.m_el[0].m_floats[2]);
  pbVar1 = h->m_el + 1;
  *(undefined8 *)h->m_el[1].m_floats = local_a8.m_el[1].m_floats._0_8_;
  *(ulong *)(h->m_el[1].m_floats + 2) =
       CONCAT44(local_a8.m_el[1].m_floats[3],local_a8.m_el[1].m_floats[2]);
  pbVar2 = h->m_el + 2;
  *(undefined8 *)h->m_el[2].m_floats = local_a8.m_el[2].m_floats._0_8_;
  *(ulong *)(h->m_el[2].m_floats + 2) =
       CONCAT44(local_a8.m_el[2].m_floats[3],local_a8.m_el[2].m_floats[2]);
  for (uVar4 = 0; uVar4 < this->m_maxIterations; uVar4 = uVar4 + 1) {
    bVar5 = anon_unknown.dwarf_6b433::p1_norm(h);
    local_b8._0_4_ = bVar5;
    local_48 = anon_unknown.dwarf_6b433::pinf_norm(h);
    bVar5 = anon_unknown.dwarf_6b433::p1_norm(u);
    bVar6 = anon_unknown.dwarf_6b433::pinf_norm(u);
    if ((ABS(local_48 * (float)local_b8._0_4_) < 1.1920929e-07) ||
       (ABS(bVar6 * bVar5) < 1.1920929e-07)) break;
    local_f4 = powf((local_48 * (float)local_b8._0_4_) / (bVar6 * bVar5),0.25);
    local_b8 = ZEXT416((uint)(1.0 / local_f4));
    local_f4 = local_f4 + -2.0;
    operator*(u,&local_f4);
    btMatrix3x3::transpose(&local_78,h);
    local_a8.m_el[0].m_floats[2] =
         (local_78.m_el[0].m_floats[2] * (float)local_b8._0_4_ + local_e8.m_el[0].m_floats[2]) * 0.5
    ;
    local_a8.m_el[1].m_floats[2] =
         (local_78.m_el[1].m_floats[2] * (float)local_b8._0_4_ + local_e8.m_el[1].m_floats[2]) * 0.5
    ;
    local_a8.m_el[2].m_floats[2] =
         (local_78.m_el[2].m_floats[2] * (float)local_b8._0_4_ + local_e8.m_el[2].m_floats[2]) * 0.5
    ;
    local_a8.m_el[0].m_floats[0] =
         (local_e8.m_el[0].m_floats[0] + local_78.m_el[0].m_floats[0] * (float)local_b8._0_4_) * 0.5
    ;
    local_a8.m_el[0].m_floats[1] =
         (local_e8.m_el[0].m_floats[1] + local_78.m_el[0].m_floats[1] * (float)local_b8._0_4_) * 0.5
    ;
    local_a8.m_el[0].m_floats[3] = 0.0;
    local_a8.m_el[1].m_floats[0] =
         (local_78.m_el[1].m_floats[0] * (float)local_b8._0_4_ + local_e8.m_el[1].m_floats[0]) * 0.5
    ;
    local_a8.m_el[1].m_floats[1] =
         (local_78.m_el[1].m_floats[1] * (float)local_b8._0_4_ + local_e8.m_el[1].m_floats[1]) * 0.5
    ;
    local_a8.m_el[1].m_floats[3] = 0.0;
    local_a8.m_el[2].m_floats[0] =
         (local_78.m_el[2].m_floats[0] * (float)local_b8._0_4_ + local_e8.m_el[2].m_floats[0]) * 0.5
    ;
    local_a8.m_el[2].m_floats[1] =
         (local_78.m_el[2].m_floats[1] * (float)local_b8._0_4_ + local_e8.m_el[2].m_floats[1]) * 0.5
    ;
    local_a8.m_el[2].m_floats[3] = 0.0;
    btMatrix3x3::operator+=(u,&local_a8);
    btMatrix3x3::inverse(u);
    *(undefined8 *)h->m_el[0].m_floats = local_e8.m_el[0].m_floats._0_8_;
    *(ulong *)(h->m_el[0].m_floats + 2) =
         CONCAT44(local_e8.m_el[0].m_floats[3],local_e8.m_el[0].m_floats[2]);
    *(undefined8 *)pbVar1->m_floats = local_e8.m_el[1].m_floats._0_8_;
    *(ulong *)(h->m_el[1].m_floats + 2) =
         CONCAT44(local_e8.m_el[1].m_floats[3],local_e8.m_el[1].m_floats[2]);
    *(undefined8 *)pbVar2->m_floats = local_e8.m_el[2].m_floats._0_8_;
    *(ulong *)(h->m_el[2].m_floats + 2) =
         CONCAT44(local_e8.m_el[2].m_floats[3],local_e8.m_el[2].m_floats[2]);
    bVar6 = anon_unknown.dwarf_6b433::p1_norm(&local_a8);
    if (bVar6 <= bVar5 * this->m_tolerance) {
      btMatrix3x3::transpose(&local_78,u);
      operator*(&local_e8,&local_78,local_f0);
      *(undefined8 *)h->m_el[0].m_floats = local_e8.m_el[0].m_floats._0_8_;
      *(ulong *)(h->m_el[0].m_floats + 2) =
           CONCAT44(local_e8.m_el[0].m_floats[3],local_e8.m_el[0].m_floats[2]);
      *(undefined8 *)pbVar1->m_floats = local_e8.m_el[1].m_floats._0_8_;
      *(ulong *)(h->m_el[1].m_floats + 2) =
           CONCAT44(local_e8.m_el[1].m_floats[3],local_e8.m_el[1].m_floats[2]);
      *(undefined8 *)pbVar2->m_floats = local_e8.m_el[2].m_floats._0_8_;
      *(ulong *)(h->m_el[2].m_floats + 2) =
           CONCAT44(local_e8.m_el[2].m_floats[3],local_e8.m_el[2].m_floats[2]);
      btMatrix3x3::transpose(&local_78,h);
      operator+(h,&local_78);
      *(ulong *)h->m_el[0].m_floats =
           CONCAT44(local_e8.m_el[0].m_floats[1] * 0.5,local_e8.m_el[0].m_floats[0] * 0.5);
      h->m_el[0].m_floats[2] = local_e8.m_el[0].m_floats[2] * 0.5;
      h->m_el[0].m_floats[3] = 0.0;
      *(ulong *)h->m_el[1].m_floats =
           CONCAT44(local_e8.m_el[1].m_floats[1] * 0.5,local_e8.m_el[1].m_floats[0] * 0.5);
      h->m_el[1].m_floats[2] = local_e8.m_el[1].m_floats[2] * 0.5;
      h->m_el[1].m_floats[3] = 0.0;
      *(ulong *)h->m_el[2].m_floats =
           CONCAT44(local_e8.m_el[2].m_floats[1] * 0.5,local_e8.m_el[2].m_floats[0] * 0.5);
      h->m_el[2].m_floats[2] = local_e8.m_el[2].m_floats[2] * 0.5;
      h->m_el[2].m_floats[3] = 0.0;
      return uVar4;
    }
  }
  btMatrix3x3::transpose(&local_e8,u);
  operator*(&local_a8,&local_e8,local_f0);
  *(undefined8 *)h->m_el[0].m_floats = local_a8.m_el[0].m_floats._0_8_;
  *(ulong *)(h->m_el[0].m_floats + 2) =
       CONCAT44(local_a8.m_el[0].m_floats[3],local_a8.m_el[0].m_floats[2]);
  *(undefined8 *)pbVar1->m_floats = local_a8.m_el[1].m_floats._0_8_;
  *(ulong *)(h->m_el[1].m_floats + 2) =
       CONCAT44(local_a8.m_el[1].m_floats[3],local_a8.m_el[1].m_floats[2]);
  *(undefined8 *)pbVar2->m_floats = local_a8.m_el[2].m_floats._0_8_;
  *(ulong *)(h->m_el[2].m_floats + 2) =
       CONCAT44(local_a8.m_el[2].m_floats[3],local_a8.m_el[2].m_floats[2]);
  btMatrix3x3::transpose(&local_e8,h);
  operator+(h,&local_e8);
  *(ulong *)h->m_el[0].m_floats =
       CONCAT44(local_a8.m_el[0].m_floats[1] * 0.5,local_a8.m_el[0].m_floats[0] * 0.5);
  h->m_el[0].m_floats[2] = local_a8.m_el[0].m_floats[2] * 0.5;
  h->m_el[0].m_floats[3] = 0.0;
  *(ulong *)h->m_el[1].m_floats =
       CONCAT44(local_a8.m_el[1].m_floats[1] * 0.5,local_a8.m_el[1].m_floats[0] * 0.5);
  h->m_el[1].m_floats[2] = local_a8.m_el[1].m_floats[2] * 0.5;
  h->m_el[1].m_floats[3] = 0.0;
  *(ulong *)h->m_el[2].m_floats =
       CONCAT44(local_a8.m_el[2].m_floats[1] * 0.5,local_a8.m_el[2].m_floats[0] * 0.5);
  h->m_el[2].m_floats[2] = local_a8.m_el[2].m_floats[2] * 0.5;
  h->m_el[2].m_floats[3] = 0.0;
  return this->m_maxIterations;
}

Assistant:

unsigned int btPolarDecomposition::decompose(const btMatrix3x3& a, btMatrix3x3& u, btMatrix3x3& h) const
{
  // Use the 'u' and 'h' matrices for intermediate calculations
  u = a;
  h = a.inverse();

  for (unsigned int i = 0; i < m_maxIterations; ++i)
  {
    const btScalar h_1 = p1_norm(h);
    const btScalar h_inf = pinf_norm(h);
    const btScalar u_1 = p1_norm(u);
    const btScalar u_inf = pinf_norm(u);

    const btScalar h_norm = h_1 * h_inf;
    const btScalar u_norm = u_1 * u_inf;

    // The matrix is effectively singular so we cannot invert it
    if (btFuzzyZero(h_norm) || btFuzzyZero(u_norm))
      break;

    const btScalar gamma = btPow(h_norm / u_norm, 0.25f);
    const btScalar inv_gamma = btScalar(1.0) / gamma;

    // Determine the delta to 'u'
    const btMatrix3x3 delta = (u * (gamma - btScalar(2.0)) + h.transpose() * inv_gamma) * btScalar(0.5);

    // Update the matrices
    u += delta;
    h = u.inverse();

    // Check for convergence
    if (p1_norm(delta) <= m_tolerance * u_1)
    {
      h = u.transpose() * a;
      h = (h + h.transpose()) * 0.5;
      return i;
    }
  }

  // The algorithm has failed to converge to the specified tolerance, but we
  // want to make sure that the matrices returned are in the right form.
  h = u.transpose() * a;
  h = (h + h.transpose()) * 0.5;

  return m_maxIterations;
}